

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetResourceStateString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,RESOURCE_STATE State)

{
  RESOURCE_STATE State_00;
  ulong uVar1;
  char *StateFlagString;
  Uint32 lsb;
  allocator local_15;
  RESOURCE_STATE local_14;
  String *pSStack_10;
  RESOURCE_STATE State_local;
  String *str;
  
  local_14 = (RESOURCE_STATE)this;
  pSStack_10 = __return_storage_ptr__;
  if (local_14 == RESOURCE_STATE_UNKNOWN) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    for (; local_14 != RESOURCE_STATE_UNKNOWN;
        local_14 = local_14 & (State_00 ^ ~RESOURCE_STATE_UNKNOWN)) {
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      State_00 = local_14 & -local_14;
      GetResourceStateFlagString(State_00);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetResourceStateString(RESOURCE_STATE State)
{
    if (State == RESOURCE_STATE_UNKNOWN)
        return "UNKNOWN";

    String str;
    while (State != 0)
    {
        if (!str.empty())
            str.push_back('|');

        Uint32 lsb = State & ~(State - 1);

        const char* StateFlagString = GetResourceStateFlagString(static_cast<RESOURCE_STATE>(lsb));
        str.append(StateFlagString);
        State = static_cast<RESOURCE_STATE>(State & ~lsb);
    }
    return str;
}